

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# party.cpp
# Opt level: O1

void __thiscall Party::Party(Party *this,World *world,Character *leader,Character *other)

{
  pointer *pppCVar1;
  iterator iVar2;
  Character *local_30;
  Character *local_28;
  Party *local_20;
  
  (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->world = world;
  local_30 = other;
  local_28 = leader;
  local_20 = this;
  std::vector<Party*,std::allocator<Party*>>::emplace_back<Party*>
            ((vector<Party*,std::allocator<Party*>> *)&world->parties,&local_20);
  iVar2._M_current =
       (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Character*,std::allocator<Character*>>::_M_realloc_insert<Character*const&>
              ((vector<Character*,std::allocator<Character*>> *)&this->members,iVar2,&local_28);
  }
  else {
    *iVar2._M_current = local_28;
    pppCVar1 = &(this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  iVar2._M_current =
       (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Character*,std::allocator<Character*>>::_M_realloc_insert<Character*const&>
              ((vector<Character*,std::allocator<Character*>> *)&this->members,iVar2,&local_30);
  }
  else {
    *iVar2._M_current = local_30;
    pppCVar1 = &(this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  this->leader = local_28;
  local_28->party = this;
  local_30->party = this;
  this->temp_expsum = 0;
  RefreshMembers(this,local_28,true);
  RefreshMembers(this,local_30,true);
  return;
}

Assistant:

Party::Party(World *world, Character *leader, Character *other)
{
	this->world = world;
	this->world->parties.push_back(this);

	this->members.push_back(leader);
	this->members.push_back(other);

	this->leader = leader;

	leader->party = this;
	other->party = this;

	this->temp_expsum = 0;

	this->RefreshMembers(leader, true);
	this->RefreshMembers(other, true);
}